

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

ssize_t sf_parse_item(nghttp2_sf_value *dest,uint8_t *begin,uint8_t *end)

{
  ssize_t sVar1;
  ssize_t sVar2;
  ssize_t slen;
  uint8_t *p;
  uint8_t *end_local;
  uint8_t *begin_local;
  nghttp2_sf_value *dest_local;
  
  sVar1 = sf_parse_bare_item(dest,begin,end);
  if (sVar1 < 0) {
    dest_local = (nghttp2_sf_value *)0xffffffffffffffff;
  }
  else {
    sVar2 = sf_parse_params(begin + sVar1,end);
    if (sVar2 < 0) {
      dest_local = (nghttp2_sf_value *)0xffffffffffffffff;
    }
    else {
      dest_local = (nghttp2_sf_value *)(begin + sVar1 + (sVar2 - (long)begin));
    }
  }
  return (ssize_t)dest_local;
}

Assistant:

static ssize_t sf_parse_item(nghttp2_sf_value *dest, const uint8_t *begin,
                             const uint8_t *end) {
  const uint8_t *p = begin;
  ssize_t slen;

  slen = sf_parse_bare_item(dest, p, end);
  if (slen < 0) {
    return -1;
  }

  p += slen;

  slen = sf_parse_params(p, end);
  if (slen < 0) {
    return -1;
  }

  p += slen;

  return p - begin;
}